

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O3

int Cmd_CommandHandleSpecial(Abc_Frame_t *pAbc,char *sCommand)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double local_48;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  uVar1 = 0;
  if ((pNtk == (Abc_Ntk_t *)0x0) || (pNtk->ntkFunc != ABC_FUNC_MAP)) {
    local_48 = 0.0;
    uVar6 = 0;
    uVar2 = 0;
    uVar5 = 0;
  }
  else {
    uVar2 = pNtk->vCis->nSize;
    uVar6 = pNtk->vCos->nSize;
    uVar5 = pNtk->nObjCounts[7];
    local_48 = Abc_NtkGetMappedArea(pNtk);
    uVar1 = 0;
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      uVar1 = Abc_NtkLevel(pNtk);
    }
  }
  pcVar3 = strstr(sCommand,"#PS");
  if (pcVar3 != (char *)0x0) {
    printf("pi=%d ",(ulong)uVar2);
    printf("po=%d ",(ulong)uVar6);
    printf("fn=%d ",(ulong)uVar5);
    printf("ma=%.1f ",local_48);
    printf("de=%d ",(ulong)uVar1);
    putchar(10);
    return 1;
  }
  pcVar3 = strstr(sCommand,"#CEC");
  if (pcVar3 != (char *)0x0) {
    printf("proofStatus=%d\n",1);
    return 1;
  }
  pcVar3 = strstr(sCommand,"#ASSERT");
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  pcVar3 = strrchr(sCommand,0x3d);
  pcVar4 = strstr(sCommand,"_PI_");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strstr(sCommand,"_PO_");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strstr(sCommand,"_NODE_");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = strstr(sCommand,"_AREA_");
        if (pcVar4 != (char *)0x0) {
          if (pcVar3 == (char *)0x0) {
            dVar10 = 0.0;
          }
          else {
            dVar10 = atof(pcVar3 + 1);
          }
          pcVar3 = strstr(sCommand,"==");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strstr(sCommand,"<=");
            if (pcVar3 == (char *)0x0) {
              return 0;
            }
            bVar7 = local_48 <= dVar10 + 1.0;
          }
          else {
            bVar7 = local_48 <= dVar10 + 1.0 && dVar10 + -1.0 <= local_48;
          }
          goto LAB_00321852;
        }
        pcVar4 = strstr(sCommand,"_DEPTH_");
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        if (pcVar3 == (char *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = atoi(pcVar3 + 1);
        }
        pcVar3 = strstr(sCommand,"==");
        if (pcVar3 != (char *)0x0) {
          bVar7 = uVar1 == uVar2;
          goto LAB_00321852;
        }
        pcVar3 = strstr(sCommand,"<=");
        if (pcVar3 == (char *)0x0) {
          return 0;
        }
        bVar9 = SBORROW4(uVar1,uVar2);
        bVar8 = (int)(uVar1 - uVar2) < 0;
        bVar7 = uVar1 == uVar2;
      }
      else {
        if (pcVar3 == (char *)0x0) {
          uVar1 = 0;
        }
        else {
          uVar1 = atoi(pcVar3 + 1);
        }
        pcVar3 = strstr(sCommand,"==");
        if (pcVar3 != (char *)0x0) {
          bVar7 = uVar5 == uVar1;
          goto LAB_00321852;
        }
        pcVar3 = strstr(sCommand,"<=");
        if (pcVar3 == (char *)0x0) {
          return 0;
        }
        bVar9 = SBORROW4(uVar5,uVar1);
        bVar8 = (int)(uVar5 - uVar1) < 0;
        bVar7 = uVar5 == uVar1;
      }
    }
    else {
      if (pcVar3 == (char *)0x0) {
        uVar1 = 0;
      }
      else {
        uVar1 = atoi(pcVar3 + 1);
      }
      pcVar3 = strstr(sCommand,"==");
      if (pcVar3 != (char *)0x0) {
        bVar7 = uVar6 == uVar1;
        goto LAB_00321852;
      }
      pcVar3 = strstr(sCommand,"<=");
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
      bVar9 = SBORROW4(uVar6,uVar1);
      bVar8 = (int)(uVar6 - uVar1) < 0;
      bVar7 = uVar6 == uVar1;
    }
  }
  else {
    if (pcVar3 == (char *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = atoi(pcVar3 + 1);
    }
    pcVar3 = strstr(sCommand,"==");
    if (pcVar3 != (char *)0x0) {
      bVar7 = uVar2 == uVar1;
      goto LAB_00321852;
    }
    pcVar3 = strstr(sCommand,"<=");
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    bVar9 = SBORROW4(uVar2,uVar1);
    bVar8 = (int)(uVar2 - uVar1) < 0;
    bVar7 = uVar2 == uVar1;
  }
  bVar7 = bVar7 || bVar9 != bVar8;
LAB_00321852:
  pcVar3 = "failed";
  if (bVar7) {
    pcVar3 = "succeeded";
  }
  puts(pcVar3);
  return 1;
}

Assistant:

int Cmd_CommandHandleSpecial( Abc_Frame_t * pAbc, const char * sCommand )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int piCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCiNum(pNtk)         : 0, piCount = 0;
    int poCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCoNum(pNtk)         : 0, poCount = 0;
    int ndCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkNodeNum(pNtk)       : 0, ndCount = 0;
    double AreaNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkGetMappedArea(pNtk) : 0, Area    = 0;
    int DepthNew   = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkLevel(pNtk)         : 0, Depth   = 0;
    if ( strstr(sCommand, "#PS") ) 
    {
        printf( "pi=%d ",   piCountNew );
        printf( "po=%d ",   poCountNew );
        printf( "fn=%d ",   ndCountNew );
        printf( "ma=%.1f ", AreaNew    );
        printf( "de=%d ",   DepthNew   );
        printf( "\n" );
        return 1;
    }
    if ( strstr(sCommand, "#CEC") ) 
    {
        //int proofStatus = Abc_NtkVerifyUsingCec(pNtk);
        int proofStatus = 1;
        // -1 (undecided), 0 (different), 1 (equivalent)
        printf( "proofStatus=%d\n", proofStatus );
        return 1;
    }
    if ( strstr(sCommand, "#ASSERT") ) 
    {
        int Status    = 0;
        char * pNumb  = strrchr( (char *)sCommand, '=' );
        if ( strstr(sCommand, "_PI_") ) 
        {
            piCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = piCountNew == piCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = piCountNew <= piCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_PO_") ) 
        {
            poCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = poCountNew == poCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = poCountNew <= poCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_NODE_") ) 
        {
            ndCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = ndCountNew == ndCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = ndCountNew <= ndCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_AREA_") ) 
        {
            double Eplison = 1.0;
            Area = pNumb ? atof(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = AreaNew >= Area - Eplison && AreaNew <= Area + Eplison;
            else if ( strstr( sCommand, "<=" ) )
                Status = AreaNew <= Area + Eplison;
            else return 0;
        }
        else if ( strstr(sCommand, "_DEPTH_") ) 
        {
            Depth = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = DepthNew == Depth;
            else if ( strstr( sCommand, "<=" ) )
                Status = DepthNew <= Depth;
            else return 0;
        }
        else return 0;
        printf( "%s\n", Status ? "succeeded" : "failed" );
        return 1;
    }
    return 0;
}